

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImStrTrimBlanks(char *buf)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  char *__src;
  char *pcVar5;
  
  lVar3 = 0;
  lVar4 = 0;
  for (__src = buf; (cVar2 = *__src, cVar2 == '\t' || (cVar2 == ' ')); __src = __src + 1) {
    lVar4 = lVar4 + -1;
    lVar3 = lVar3 + 1;
  }
  pcVar5 = __src;
  if (cVar2 != '\0') {
    do {
      pcVar1 = pcVar5 + 1;
      pcVar5 = pcVar5 + 1;
    } while (*pcVar1 != '\0');
    for (; (__src < pcVar5 && ((pcVar5[-1] == ' ' || (pcVar5[-1] == '\t')))); pcVar5 = pcVar5 + -1)
    {
    }
  }
  if (lVar3 != 0) {
    memmove(buf,__src,(size_t)(pcVar5 + (-lVar3 - (long)buf)));
  }
  pcVar5[lVar4] = '\0';
  return;
}

Assistant:

void ImStrTrimBlanks(char* buf)
{
    char* p = buf;
    while (p[0] == ' ' || p[0] == '\t')     // Leading blanks
        p++;
    char* p_start = p;
    while (*p != 0)                         // Find end of string
        p++;
    while (p > p_start && (p[-1] == ' ' || p[-1] == '\t'))  // Trailing blanks
        p--;
    if (p_start != buf)                     // Copy memory if we had leading blanks
        memmove(buf, p_start, p - p_start);
    buf[p - p_start] = 0;                   // Zero terminate
}